

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_memory.h
# Opt level: O0

size_t absl::lts_20250127::container_internal::
       TypeErasedApplyToSlotFn<absl::lts_20250127::container_internal::StringHash,std::basic_string_view<char,std::char_traits<char>>>
                 (void *fn,void *slot)

{
  size_t sVar1;
  StringHash *f;
  void *slot_local;
  void *fn_local;
  
  sVar1 = StringHash::operator()((StringHash *)fn,*slot);
  return sVar1;
}

Assistant:

size_t TypeErasedApplyToSlotFn(const void* fn, void* slot) {
  const auto* f = static_cast<const Fn*>(fn);
  return (*f)(*static_cast<const T*>(slot));
}